

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svm_helper.c
# Opt level: O1

void helper_vmrun_x86_64_cold_1(void)

{
  CPUX86State *in_RDI;
  uintptr_t unaff_retaddr;
  
  if ((in_RDI->intercept & 0x100000000) == 0) {
    return;
  }
  cpu_vmexit_x86_64(in_RDI,0x80,0,unaff_retaddr);
}

Assistant:

void cpu_svm_check_intercept_param(CPUX86State *env, uint32_t type,
                                   uint64_t param, uintptr_t retaddr)
{
    CPUState *cs = env_cpu(env);

    if (likely(!(env->hflags & HF_GUEST_MASK))) {
        return;
    }

    if ((int32_t)type >= SVM_EXIT_READ_CR0 && type <= SVM_EXIT_READ_CR0 + 8) {
        if (env->intercept_cr_read & (1 << (type - SVM_EXIT_READ_CR0))) {
            cpu_vmexit(env, type, param, retaddr);
        }
    } else if (type >= SVM_EXIT_WRITE_CR0 && type <= SVM_EXIT_WRITE_CR0 + 8) {
        if (env->intercept_cr_write & (1 << (type - SVM_EXIT_WRITE_CR0))) {
            cpu_vmexit(env, type, param, retaddr);
        }
    } else if (type >= SVM_EXIT_READ_DR0 && type <= SVM_EXIT_READ_DR0 + 7) {
        if (env->intercept_dr_read & (1 << (type - SVM_EXIT_READ_DR0))) {
            cpu_vmexit(env, type, param, retaddr);
        }
    } else if (type >= SVM_EXIT_WRITE_DR0 && type <= SVM_EXIT_WRITE_DR0 + 7) {
        if (env->intercept_dr_write & (1 << (type - SVM_EXIT_WRITE_DR0))) {
            cpu_vmexit(env, type, param, retaddr);
        }
    } else if (type >= SVM_EXIT_EXCP_BASE && type <= SVM_EXIT_EXCP_BASE + 31) {
        if (env->intercept_exceptions & (1 << (type - SVM_EXIT_EXCP_BASE))) {
            cpu_vmexit(env, type, param, retaddr);
        }
    } else if (type == SVM_EXIT_MSR) {
        if (env->intercept & (1ULL << (SVM_EXIT_MSR - SVM_EXIT_INTR))) {
            /* FIXME: this should be read in at vmrun (faster this way?) */
            uint64_t addr = x86_ldq_phys(cs, env->vm_vmcb +
                    offsetof(struct vmcb,
                        control.msrpm_base_pa));
            uint32_t t0, t1, ecx;

            ecx = env->regs[R_ECX];
#define XRANGE(x, a, b) (x >= a && x <= b)
            if (XRANGE(ecx, 0, 0x1fff)) {
                t0 = (ecx * 2) % 8;
                t1 = (ecx * 2) / 8;
            } else if (XRANGE(ecx, 0xc0000000, 0xc0001fff)) {
                t0 = (8192 + ecx - 0xc0000000) * 2;
                t1 = (t0 / 8);
                t0 %= 8;
            } else if (XRANGE(ecx, 0xc0010000, 0xc0011fff)) {
                t0 = (16384 + ecx - 0xc0010000) * 2;
                t1 = (t0 / 8);
                t0 %= 8;
            } else {
                cpu_vmexit(env, type, param, retaddr);
                t0 = 0;
                t1 = 0;
            }
#undef XRANGE

            if (x86_ldub_phys(cs, addr + t1) & ((1 << param) << t0)) {
                cpu_vmexit(env, type, param, retaddr);
            }
        }
    } else if (env->intercept & (1ULL << (type - SVM_EXIT_INTR))) {
        cpu_vmexit(env, type, param, retaddr);
    }
}